

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Room * __thiscall Model<Room>::save(Model<Room> *this)

{
  Room *pRVar1;
  pair<int,_Room> local_30;
  Model<Room> *local_10;
  Model<Room> *this_local;
  
  local_10 = this;
  pRVar1 = (Room *)__dynamic_cast(this,&typeinfo,&Room::typeinfo,0);
  if (pRVar1 == (Room *)0x0) {
    __cxa_bad_cast();
  }
  std::pair<int,_Room>::pair<int_&,_Room_&,_true>(&local_30,&this->id,pRVar1);
  std::map<int,Room,std::less<int>,std::allocator<std::pair<int_const,Room>>>::
  insert<std::pair<int,Room>>
            ((map<int,Room,std::less<int>,std::allocator<std::pair<int_const,Room>>> *)&objectList,
             &local_30);
  pRVar1 = (Room *)__dynamic_cast(this,&typeinfo,&Room::typeinfo,0);
  if (pRVar1 == (Room *)0x0) {
    __cxa_bad_cast();
  }
  return pRVar1;
}

Assistant:

T &Model<T>::save() {
    Model<T>::objectList.insert(pair<int, T>(this->id, dynamic_cast<T &> (*this)));
    return dynamic_cast<T &> (*this);
}